

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void __thiscall
DebugDrawcallback::processTriangle
          (DebugDrawcallback *this,cbtVector3 *triangle,int partId,int triangleIndex)

{
  cbtVector3 *pcVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  cbtScalar cVar12;
  undefined1 auVar13 [16];
  uint uVar14;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  cbtVector3 center;
  cbtVector3 normalColor;
  undefined1 local_98 [8];
  float fStack_90;
  undefined1 local_88 [8];
  float fStack_80;
  undefined1 local_78 [8];
  float fStack_70;
  float local_64;
  float local_60;
  float local_5c;
  undefined1 local_58 [8];
  float fStack_50;
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  
  cVar2 = triangle->m_floats[0];
  fVar19 = triangle->m_floats[1];
  cVar3 = (this->m_worldTrans).m_basis.m_el[0].m_floats[0];
  fVar20 = (this->m_worldTrans).m_basis.m_el[0].m_floats[1];
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar20)),ZEXT416((uint)cVar2),
                            ZEXT416((uint)cVar3));
  cVar4 = triangle->m_floats[2];
  cVar5 = (this->m_worldTrans).m_basis.m_el[0].m_floats[2];
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)cVar4),ZEXT416((uint)cVar5));
  cVar6 = (this->m_worldTrans).m_basis.m_el[1].m_floats[0];
  fVar18 = (this->m_worldTrans).m_basis.m_el[1].m_floats[1];
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * fVar19)),ZEXT416((uint)cVar2),
                            ZEXT416((uint)cVar6));
  cVar7 = (this->m_worldTrans).m_basis.m_el[1].m_floats[2];
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)cVar4),ZEXT416((uint)cVar7));
  cVar8 = (this->m_worldTrans).m_basis.m_el[2].m_floats[0];
  fVar17 = (this->m_worldTrans).m_basis.m_el[2].m_floats[1];
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar19)),ZEXT416((uint)cVar8),
                            ZEXT416((uint)cVar2));
  cVar2 = (this->m_worldTrans).m_basis.m_el[2].m_floats[2];
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)cVar2),ZEXT416((uint)cVar4));
  fVar19 = (this->m_worldTrans).m_origin.m_floats[0];
  fVar9 = (this->m_worldTrans).m_origin.m_floats[1];
  auVar13 = vinsertps_avx(ZEXT416((uint)(auVar13._0_4_ + fVar19)),
                          ZEXT416((uint)(auVar15._0_4_ + fVar9)),0x10);
  fVar10 = (this->m_worldTrans).m_origin.m_floats[2];
  _local_78 = vinsertps_avx(auVar13,ZEXT416((uint)(fVar10 + auVar16._0_4_)),0x28);
  cVar4 = triangle[1].m_floats[0];
  fVar11 = triangle[1].m_floats[1];
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar11)),ZEXT416((uint)cVar4),
                            ZEXT416((uint)cVar3));
  cVar12 = triangle[1].m_floats[2];
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)cVar12),ZEXT416((uint)cVar5));
  auVar15 = vmulss_avx512f(ZEXT416((uint)fVar18),ZEXT416((uint)fVar11));
  auVar15 = vfmadd231ss_avx512f(auVar15,ZEXT416((uint)cVar4),ZEXT416((uint)cVar6));
  auVar16 = vfmadd231ss_avx512f(auVar15,ZEXT416((uint)cVar12),ZEXT416((uint)cVar7));
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar11)),ZEXT416((uint)cVar8),
                            ZEXT416((uint)cVar4));
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)cVar2),ZEXT416((uint)cVar12));
  auVar16 = vaddss_avx512f(ZEXT416((uint)fVar9),auVar16);
  auVar13 = vinsertps_avx(ZEXT416((uint)(auVar13._0_4_ + fVar19)),auVar16,0x10);
  _local_88 = vinsertps_avx(auVar13,ZEXT416((uint)(fVar10 + auVar15._0_4_)),0x28);
  cVar4 = triangle[2].m_floats[0];
  fVar11 = triangle[2].m_floats[1];
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar11)),ZEXT416((uint)cVar4),
                            ZEXT416((uint)cVar3));
  cVar3 = triangle[2].m_floats[2];
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)cVar3),ZEXT416((uint)cVar5));
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * fVar11)),ZEXT416((uint)cVar4),
                            ZEXT416((uint)cVar6));
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)cVar3),ZEXT416((uint)cVar7));
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar11)),ZEXT416((uint)cVar4),
                            ZEXT416((uint)cVar8));
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)cVar3),ZEXT416((uint)cVar2));
  auVar13 = vinsertps_avx(ZEXT416((uint)(fVar19 + auVar13._0_4_)),
                          ZEXT416((uint)(fVar9 + auVar15._0_4_)),0x10);
  _local_98 = vinsertps_avx(auVar13,ZEXT416((uint)(fVar10 + auVar16._0_4_)),0x28);
  auVar13 = vinsertps_avx(ZEXT416((uint)(((float)local_78._0_4_ + (float)local_88._0_4_ +
                                         (float)local_98._0_4_) * 0.33333334)),
                          ZEXT416((uint)(((float)local_78._4_4_ + (float)local_88._4_4_ +
                                         (float)local_98._4_4_) * 0.33333334)),0x10);
  _local_58 = vinsertps_avx(auVar13,ZEXT416((uint)((fStack_70 + fStack_80 + fStack_90) * 0.33333334)
                                           ),0x28);
  uVar14 = (*this->m_debugDrawer->_vptr_cbtIDebugDraw[0xe])
                     (this->m_debugDrawer,triangle,CONCAT44(in_register_00000014,partId),
                      CONCAT44(in_register_0000000c,triangleIndex));
  if ((uVar14 >> 0xe & 1) != 0) {
    auVar15 = vfmsub231ss_fma(ZEXT416((uint)(((float)local_98._4_4_ - (float)local_78._4_4_) *
                                            (fStack_80 - fStack_70))),
                              ZEXT416((uint)((float)local_88._4_4_ - (float)local_78._4_4_)),
                              ZEXT416((uint)(fStack_90 - fStack_70)));
    auVar13 = vfmsub231ss_fma(ZEXT416((uint)((fStack_90 - fStack_70) *
                                            ((float)local_88._0_4_ - (float)local_78._0_4_))),
                              ZEXT416((uint)((float)local_98._0_4_ - (float)local_78._0_4_)),
                              ZEXT416((uint)(fStack_80 - fStack_70)));
    fVar19 = auVar13._0_4_;
    auVar16 = vfmsub231ss_fma(ZEXT416((uint)(((float)local_98._0_4_ - (float)local_78._0_4_) *
                                            ((float)local_88._4_4_ - (float)local_78._4_4_))),
                              ZEXT416((uint)((float)local_88._0_4_ - (float)local_78._0_4_)),
                              ZEXT416((uint)((float)local_98._4_4_ - (float)local_78._4_4_)));
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar19)),auVar15,auVar15);
    auVar13 = vfmadd231ss_fma(auVar13,auVar16,auVar16);
    if (auVar13._0_4_ < 0.0) {
      local_64 = auVar16._0_4_;
      local_60 = fVar19;
      local_5c = auVar15._0_4_;
      fVar17 = sqrtf(auVar13._0_4_);
      fVar20 = local_5c;
      fVar19 = local_60;
      fVar18 = local_64;
    }
    else {
      auVar13 = vsqrtss_avx(auVar13,auVar13);
      fVar17 = auVar13._0_4_;
      fVar20 = auVar15._0_4_;
      fVar18 = auVar16._0_4_;
    }
    fVar17 = 1.0 / fVar17;
    local_38 = 0x3f8000003f800000;
    uStack_30 = 0;
    auVar13 = vinsertps_avx(ZEXT416((uint)(fVar17 * fVar20 + (float)local_58._0_4_)),
                            ZEXT416((uint)(fVar17 * fVar19 + (float)local_58._4_4_)),0x10);
    local_48 = vinsertps_avx(auVar13,ZEXT416((uint)(fVar18 * fVar17 + fStack_50)),0x28);
    (*this->m_debugDrawer->_vptr_cbtIDebugDraw[4])();
  }
  pcVar1 = &this->m_color;
  (*this->m_debugDrawer->_vptr_cbtIDebugDraw[4])(this->m_debugDrawer,local_78,local_88,pcVar1);
  (*this->m_debugDrawer->_vptr_cbtIDebugDraw[4])(this->m_debugDrawer,local_88,local_98,pcVar1);
  (*this->m_debugDrawer->_vptr_cbtIDebugDraw[4])(this->m_debugDrawer,local_98,local_78,pcVar1);
  return;
}

Assistant:

virtual void processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
	{
		(void)partId;
		(void)triangleIndex;

		cbtVector3 wv0, wv1, wv2;
		wv0 = m_worldTrans * triangle[0];
		wv1 = m_worldTrans * triangle[1];
		wv2 = m_worldTrans * triangle[2];
		cbtVector3 center = (wv0 + wv1 + wv2) * cbtScalar(1. / 3.);

		if (m_debugDrawer->getDebugMode() & cbtIDebugDraw::DBG_DrawNormals)
		{
			cbtVector3 normal = (wv1 - wv0).cross(wv2 - wv0);
			normal.normalize();
			cbtVector3 normalColor(1, 1, 0);
			m_debugDrawer->drawLine(center, center + normal, normalColor);
		}
		m_debugDrawer->drawLine(wv0, wv1, m_color);
		m_debugDrawer->drawLine(wv1, wv2, m_color);
		m_debugDrawer->drawLine(wv2, wv0, m_color);
	}